

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetStep.c
# Opt level: O2

Aig_Obj_t * Saig_ManRetimeNodeBwd(Aig_Man_t *p,Aig_Obj_t *pObjLo)

{
  ulong uVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  Aig_Obj_t *pAVar5;
  uint uVar6;
  
  if (p->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x81,"Aig_Obj_t *Saig_ManRetimeNodeBwd(Aig_Man_t *, Aig_Obj_t *)");
  }
  iVar2 = Aig_ObjCioId(pObjLo);
  if (iVar2 < 1) {
    __assert_fail("Aig_ObjCioId(pObjLo) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x82,"Aig_Obj_t *Saig_ManRetimeNodeBwd(Aig_Man_t *, Aig_Obj_t *)");
  }
  iVar2 = Saig_ObjIsLo(p,pObjLo);
  if (iVar2 == 0) {
    __assert_fail("Saig_ObjIsLo(p, pObjLo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x83,"Aig_Obj_t *Saig_ManRetimeNodeBwd(Aig_Man_t *, Aig_Obj_t *)");
  }
  iVar2 = Aig_ObjCioId(pObjLo);
  pAVar3 = Saig_ManLi(p,iVar2 - p->nTruePis);
  uVar4 = (ulong)pAVar3->pFanin0 & 0xfffffffffffffffe;
  if ((*(uint *)(uVar4 + 0x18) & 7) - 7 < 0xfffffffe) {
    return (Aig_Obj_t *)0x0;
  }
  uVar1 = *(ulong *)(uVar4 + 8);
  uVar4 = *(ulong *)(uVar4 + 0x10);
  uVar6 = (uint)pAVar3->pFanin0;
  pAVar3 = Aig_ObjCreateCo(p,(Aig_Obj_t *)(uVar1 ^ uVar6 & 1));
  (pAVar3->field_0).CioId = p->nObjs[3] + -1;
  pAVar3 = Aig_ObjCreateCo(p,(Aig_Obj_t *)(uVar6 & 1 ^ uVar4));
  (pAVar3->field_0).CioId = p->nObjs[3] + -1;
  pAVar3 = Aig_ObjCreateCi(p);
  (pAVar3->field_0).CioId = p->nObjs[2] + -1;
  pAVar5 = Aig_ObjCreateCi(p);
  (pAVar5->field_0).CioId = p->nObjs[2] + -1;
  p->nRegs = p->nRegs + 2;
  pAVar3 = Aig_And(p,(Aig_Obj_t *)((ulong)(((uint)uVar1 ^ uVar6) & 1) ^ (ulong)pAVar3),
                   (Aig_Obj_t *)((ulong)(((uint)uVar4 ^ uVar6) & 1) ^ (ulong)pAVar5));
  return pAVar3;
}

Assistant:

Aig_Obj_t * Saig_ManRetimeNodeBwd( Aig_Man_t * p, Aig_Obj_t * pObjLo )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    Aig_Obj_t * pLo0New, * pLo1New;
    Aig_Obj_t * pLi0New, * pLi1New;
    Aig_Obj_t * pObj, * pObjNew, * pObjLi;
    int fCompl0, fCompl1;

    assert( Saig_ManRegNum(p) > 0 );
    assert( Aig_ObjCioId(pObjLo) > 0 );
    assert( Saig_ObjIsLo(p, pObjLo) );

    // get the corresponding latch input
    pObjLi = Saig_ManLi( p, Aig_ObjCioId(pObjLo) - Saig_ManPiNum(p) );

    // get the node
    pObj = Aig_ObjFanin0(pObjLi);
    if ( !Aig_ObjIsNode(pObj) )
        return NULL;

    // get the fanins
    pFanin0 = Aig_ObjFanin0(pObj);
    pFanin1 = Aig_ObjFanin1(pObj);

    // get the complemented attributes of the fanins
    fCompl0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFaninC0(pObjLi);
    fCompl1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFaninC0(pObjLi);

    // create latch inputs
    pLi0New = Aig_ObjCreateCo( p, Aig_NotCond(pFanin0, fCompl0) );
    pLi0New->CioId = Aig_ManCoNum(p) - 1;
    pLi1New = Aig_ObjCreateCo( p, Aig_NotCond(pFanin1, fCompl1) );
    pLi1New->CioId = Aig_ManCoNum(p) - 1;

    // create latch outputs
    pLo0New = Aig_ObjCreateCi(p);
    pLo0New->CioId = Aig_ManCiNum(p) - 1;
    pLo1New = Aig_ObjCreateCi(p);
    pLo1New->CioId = Aig_ManCiNum(p) - 1;
    pLo0New = Aig_NotCond( pLo0New, fCompl0 );
    pLo1New = Aig_NotCond( pLo1New, fCompl1 );
    p->nRegs += 2;

    // create node
    pObjNew = Aig_And( p, pLo0New, pLo1New );
//    assert( pObjNew->fPhase == 0 );
    return pObjNew;
}